

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void losestr(int num,boolean force)

{
  undefined4 local_14;
  int ustr;
  boolean force_local;
  int num_local;
  
  local_14 = u.acurr.a[0] - num;
  ustr = num;
  while (local_14 < 3) {
    local_14 = local_14 + 1;
    ustr = ustr + -1;
    if (u.umonnum == u.umonster) {
      u.uhp = u.uhp + -6;
      u.uhpmax = u.uhpmax + -6;
    }
    else {
      u.mh = u.mh + -6;
      u.mhmax = u.mhmax + -6;
    }
  }
  adjattrib(0,-ustr,force,1);
  return;
}

Assistant:

void losestr(int num, boolean force)
{
	int ustr = ABASE(A_STR) - num;

	while (ustr < 3) {
	    ++ustr;
	    --num;
	    if (Upolyd) {
		u.mh -= 6;
		u.mhmax -= 6;
	    } else {
		u.uhp -= 6;
		u.uhpmax -= 6;
	    }
	}
	adjattrib(A_STR, -num, force, 1);
}